

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_audit.cpp
# Opt level: O3

void compare_enums(vector<t_enum_*,_std::allocator<t_enum_*>_> *newEnumList,
                  vector<t_enum_*,_std::allocator<t_enum_*>_> *oldEnumList)

{
  _Rb_tree_header *p_Var1;
  mapped_type ptVar2;
  int iVar3;
  undefined4 extraout_var;
  mapped_type *pptVar4;
  undefined4 extraout_var_00;
  iterator iVar5;
  undefined4 extraout_var_01;
  pointer pptVar6;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*>_>_>
  newEnumMap;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*>_>_>
  local_60;
  
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pptVar6 = (newEnumList->super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (pptVar6 !=
      (newEnumList->super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      ptVar2 = *pptVar6;
      iVar3 = (*(ptVar2->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar2);
      pptVar4 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*>_>_>
                              *)&local_60,(key_type *)CONCAT44(extraout_var,iVar3));
      *pptVar4 = ptVar2;
      pptVar6 = pptVar6 + 1;
    } while (pptVar6 !=
             (newEnumList->super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  pptVar6 = (oldEnumList->super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar6 !=
      (oldEnumList->super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      iVar3 = (*((*pptVar6)->super_t_type).super_t_doc._vptr_t_doc[3])();
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*>_>_>
              ::find(&local_60,(key_type *)CONCAT44(extraout_var_00,iVar3));
      if ((_Rb_tree_header *)iVar5._M_node == p_Var1) {
        iVar3 = (*((*pptVar6)->super_t_type).super_t_doc._vptr_t_doc[3])();
        thrift_audit_warning
                  (1,"Enum %s not found in new thrift file\n",
                   *(undefined8 *)CONCAT44(extraout_var_01,iVar3));
      }
      else {
        compare_enum_values(*(t_enum **)(iVar5._M_node + 2),*pptVar6);
      }
      pptVar6 = pptVar6 + 1;
    } while (pptVar6 !=
             (oldEnumList->super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_enum_*>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void compare_enums(const std::vector<t_enum*>& newEnumList, const std::vector<t_enum*>& oldEnumList)
{
   std::map<std::string,t_enum*> newEnumMap;
   std::vector<t_enum*>::const_iterator newEnumIt;
   for(newEnumIt = newEnumList.begin(); newEnumIt != newEnumList.end(); newEnumIt++)
   {
      newEnumMap[(*newEnumIt)->get_name()] = *newEnumIt;
   }
   std::vector<t_enum*>::const_iterator oldEnumIt;
   for(oldEnumIt = oldEnumList.begin(); oldEnumIt != oldEnumList.end(); oldEnumIt++)
   {
      std::map<std::string,t_enum*>::iterator newEnumMapIt;
      newEnumMapIt = newEnumMap.find((*oldEnumIt)->get_name());

      if(newEnumMapIt == newEnumMap.end())
      {
         thrift_audit_warning(1, "Enum %s not found in new thrift file\n",(*oldEnumIt)->get_name().c_str());
      }
      else
      {
         compare_enum_values(newEnumMapIt->second, *oldEnumIt);
      }
   }
}